

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void __thiscall
Omega_h::HostWrite<double>::HostWrite
          (HostWrite<double> *this,LO size_in,double offset,double stride,string *name_in)

{
  int iVar1;
  Write<double> local_20;
  
  Write<double>::Write(&local_20,size_in,offset,stride,name_in);
  (this->write_).shared_alloc_.alloc = local_20.shared_alloc_.alloc;
  if (((ulong)local_20.shared_alloc_.alloc & 7) == 0 && local_20.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc = (Alloc *)((local_20.shared_alloc_.alloc)->size * 8 + 1);
      iVar1 = (local_20.shared_alloc_.alloc)->use_count + -1;
    }
    else {
      iVar1 = (local_20.shared_alloc_.alloc)->use_count;
    }
    (this->write_).shared_alloc_.direct_ptr = local_20.shared_alloc_.direct_ptr;
    (local_20.shared_alloc_.alloc)->use_count = iVar1;
    if (iVar1 == 0) {
      Alloc::~Alloc(local_20.shared_alloc_.alloc);
      operator_delete(local_20.shared_alloc_.alloc,0x48);
    }
  }
  else {
    (this->write_).shared_alloc_.direct_ptr = local_20.shared_alloc_.direct_ptr;
  }
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}